

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::BuildSystemImpl::configureFileSystem(BuildSystemImpl *this,int mode)

{
  FileSystem *pFVar1;
  FileSystem *pFVar2;
  undefined *puVar3;
  
  pFVar2 = (FileSystem *)operator_new(0x10);
  pFVar1 = (this->fileSystem)._M_t.
           super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
           .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
  if (mode == 1) {
    puVar3 = &llbuild::basic::DeviceAgnosticFileSystem::vtable;
  }
  else {
    puVar3 = &llbuild::basic::ChecksumOnlyFileSystem::vtable;
  }
  pFVar2->_vptr_FileSystem = (_func_int **)(puVar3 + 0x10);
  pFVar2[1]._vptr_FileSystem = (_func_int **)pFVar1;
  (this->fileSystem)._M_t.
  super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = pFVar2;
  return;
}

Assistant:

void configureFileSystem(int mode) {
    if (mode == 1) {
      std::unique_ptr<basic::FileSystem> newFS(
          new DeviceAgnosticFileSystem(std::move(fileSystem)));
      fileSystem.swap(newFS);
    } else if (mode == 2) {
      std::unique_ptr<basic::FileSystem> newFS(
          new ChecksumOnlyFileSystem(std::move(fileSystem)));
      fileSystem.swap(newFS);
    }
  }